

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotErrorBarsEx<ImPlot::GetterError<short>>(char *label_id,GetterError<short> *getter)

{
  float fVar1;
  ImPlotContext *pIVar2;
  bool bVar3;
  ImU32 col;
  ImDrawList *this;
  int i;
  int iVar4;
  float fVar5;
  ImVec2 local_a8;
  ImVec2 p1;
  ImPlotPointError e;
  ImVec2 local_68;
  ImVec2 p2;
  
  bVar3 = BeginItem(label_id,-1);
  if (bVar3) {
    if (GImPlot->FitThisFrame == true) {
      for (iVar4 = 0; iVar4 < getter->Count; iVar4 = iVar4 + 1) {
        GetterError<short>::operator()(&e,getter,iVar4);
        p1 = (ImVec2)e.X;
        FitPoint((ImPlotPoint *)&p1);
        p1 = (ImVec2)e.X;
        FitPoint((ImPlotPoint *)&p1);
      }
    }
    pIVar2 = GImPlot;
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar2->NextItemData).Colors + 4);
    fVar1 = (pIVar2->NextItemData).ErrorBarSize;
    fVar5 = fVar1 * 0.5;
    for (iVar4 = 0; iVar4 < getter->Count; iVar4 = iVar4 + 1) {
      GetterError<short>::operator()(&e,getter,iVar4);
      p1 = PlotToPixels(e.X,e.Y - e.Neg,-1);
      p2 = PlotToPixels(e.X,e.Y + e.Pos,-1);
      ImDrawList::AddLine(this,&p1,&p2,col,(pIVar2->NextItemData).ErrorBarWeight);
      if (0.0 < fVar1) {
        local_68.y = p1.y;
        local_68.x = p1.x - fVar5;
        local_a8.y = p1.y + 0.0;
        local_a8.x = p1.x + fVar5;
        ImDrawList::AddLine(this,&local_68,&local_a8,col,(pIVar2->NextItemData).ErrorBarWeight);
        local_68.y = p2.y;
        local_68.x = p2.x - fVar5;
        local_a8.y = p2.y + 0.0;
        local_a8.x = p2.x + fVar5;
        ImDrawList::AddLine(this,&local_68,&local_a8,col,(pIVar2->NextItemData).ErrorBarWeight);
      }
    }
    EndItem();
  }
  return;
}

Assistant:

void PlotErrorBarsEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPointError e = getter(i);
                FitPoint(ImPlotPoint(e.X , e.Y - e.Neg));
                FitPoint(ImPlotPoint(e.X , e.Y + e.Pos ));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        const ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_ErrorBar]);
        const bool rend_whisker  = s.ErrorBarSize > 0;
        const float half_whisker = s.ErrorBarSize * 0.5f;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPointError e = getter(i);
            ImVec2 p1 = PlotToPixels(e.X, e.Y - e.Neg);
            ImVec2 p2 = PlotToPixels(e.X, e.Y + e.Pos);
            DrawList.AddLine(p1,p2,col, s.ErrorBarWeight);
            if (rend_whisker) {
                DrawList.AddLine(p1 - ImVec2(half_whisker, 0), p1 + ImVec2(half_whisker, 0), col, s.ErrorBarWeight);
                DrawList.AddLine(p2 - ImVec2(half_whisker, 0), p2 + ImVec2(half_whisker, 0), col, s.ErrorBarWeight);
            }
        }
        EndItem();
    }
}